

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O0

Vec_Ptr_t *
Abc_GiaDeriveSops(Abc_Ntk_t *pNtkNew,Gia_Man_t *p,Vec_Wec_t *vSupps,int nCubeLim,int nBTLimit,
                 int nCostMax,int fCanon,int fReverse,int fCnfShared,int fVerbose)

{
  Mem_Flex_t *pMan;
  FILE *pFile;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  Vec_Wec_t *p_00;
  abctime aVar7;
  Vec_Int_t *p_01;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Vec_Ptr_t *p_02;
  ProgressBar *p_03;
  Vec_Int_t *pVVar10;
  char *pcVar11;
  void *Entry_00;
  int local_16c;
  int local_13c;
  Vec_Str_t *local_c8;
  Vec_Str_t *vSop;
  Vec_Int_t *vSupp;
  int iCoThis;
  int iEntry;
  Vec_Int_t *vMap;
  Cnf_Dat_t *pCnf;
  Vec_Wec_t *vClasses;
  int *pOrder;
  int iCo;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vReprSuppSizes;
  Vec_Int_t *vClass;
  Vec_Int_t *vReprs;
  Vec_Ptr_t *vSopsRepr;
  Vec_Ptr_t *vSops;
  abctime clk;
  ProgressBar *pProgress;
  int nCostMax_local;
  int nBTLimit_local;
  int nCubeLim_local;
  Vec_Wec_t *vSupps_local;
  Gia_Man_t *p_local;
  Abc_Ntk_t *pNtkNew_local;
  
  aVar6 = Abc_Clock();
  vSopsRepr = (Vec_Ptr_t *)0x0;
  vMap = (Vec_Int_t *)0x0;
  _iCoThis = (Vec_Int_t *)0x0;
  p_00 = Gia_ManIsoStrashReduceInt(p,vSupps,0);
  if (fVerbose != 0) {
    uVar1 = Vec_WecSize(p_00);
    uVar2 = Gia_ManCoNum(p);
    printf("Considering %d (out of %d) outputs. ",(ulong)uVar1,(ulong)uVar2);
    aVar7 = Abc_Clock();
    Abc_PrintTime(1,"Reduction time",aVar7 - aVar6);
  }
  p_01 = Vec_WecCollectFirsts(p_00);
  iVar3 = Vec_IntSize(p_01);
  pVVar8 = Vec_IntAlloc(iVar3);
  for (Entry = 0; iVar3 = Vec_IntSize(p_01), Entry < iVar3; Entry = Entry + 1) {
    iVar3 = Vec_IntEntry(p_01,Entry);
    pVVar10 = Vec_WecEntry(vSupps,iVar3);
    iVar3 = Vec_IntSize(pVVar10);
    Vec_IntPush(pVVar8,iVar3);
  }
  piVar9 = Vec_IntArray(pVVar8);
  iVar3 = Vec_IntSize(pVVar8);
  piVar9 = Abc_MergeSortCost(piVar9,iVar3);
  Vec_IntFree(pVVar8);
  if (fCnfShared != 0) {
    iVar3 = Gia_ManObjNum(p);
    _iCoThis = Vec_IntStartFull(iVar3);
    vMap = (Vec_Int_t *)Mf_ManGenerateCnf(p,8,1,0,0);
  }
  iVar3 = Vec_IntSize(p_01);
  p_02 = Vec_PtrStart(iVar3);
  pFile = _stdout;
  iVar3 = Vec_IntSize(p_01);
  p_03 = Extra_ProgressBarStart(pFile,iVar3);
  Extra_ProgressBarUpdate(p_03,0,(char *)0x0);
  for (Entry = 0; iVar3 = Vec_IntSize(p_01), Entry < iVar3; Entry = Entry + 1) {
    iVar3 = Vec_IntSize(p_01);
    iVar3 = piVar9[(iVar3 + -1) - Entry];
    iVar4 = Vec_IntEntry(p_01,iVar3);
    pVVar8 = Vec_WecEntry(vSupps,iVar4);
    iVar5 = Vec_IntSize(pVVar8);
    if (iVar5 < 2) {
      Vec_PtrWriteEntry(p_02,iVar3,(void *)0x1);
    }
    else {
      if ((fCnfShared == 0) || (fCanon != 0)) {
        if (Entry == 0) {
          local_16c = fVerbose;
        }
        else {
          local_16c = 0;
        }
        pVVar10 = Vec_WecEntry(p_00,iVar3);
        local_c8 = Abc_NtkClpGiaOne(p,iVar4,nCubeLim,nBTLimit,fCanon,fReverse,pVVar8,local_16c,
                                    pVVar10,vSupps);
      }
      else {
        if (Entry == 0) {
          local_13c = fVerbose;
        }
        else {
          local_13c = 0;
        }
        pVVar10 = Vec_WecEntry(p_00,iVar3);
        local_c8 = Abc_NtkClpGiaOne2((Cnf_Dat_t *)vMap,p,iVar4,nCubeLim,nBTLimit,0,fReverse,pVVar8,
                                     _iCoThis,local_13c,pVVar10,vSupps);
      }
      if (local_c8 == (Vec_Str_t *)0x0) goto LAB_0027f07f;
      pVVar8 = Vec_WecEntry(vSupps,iVar4);
      iVar4 = Vec_IntSize(pVVar8);
      pcVar11 = Vec_StrArray(local_c8);
      iVar5 = Abc_SopGetVarNum(pcVar11);
      if (iVar4 != iVar5) {
        __assert_fail("Vec_IntSize( Vec_WecEntry(vSupps, iCoThis) ) == Abc_SopGetVarNum(Vec_StrArray(vSop))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCollapse.c"
                      ,0x33b,
                      "Vec_Ptr_t *Abc_GiaDeriveSops(Abc_Ntk_t *, Gia_Man_t *, Vec_Wec_t *, int, int, int, int, int, int, int)"
                     );
      }
      Extra_ProgressBarUpdate(p_03,Entry,(char *)0x0);
      pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
      pcVar11 = Vec_StrArray(local_c8);
      pcVar11 = Abc_SopRegister(pMan,pcVar11);
      Vec_PtrWriteEntry(p_02,iVar3,pcVar11);
      Vec_StrFree(local_c8);
    }
  }
  Extra_ProgressBarStop(p_03);
  if (fCnfShared != 0) {
    Cnf_DataFree((Cnf_Dat_t *)vMap);
    Vec_IntFree(_iCoThis);
  }
  iVar3 = Gia_ManCoNum(p);
  vSopsRepr = Vec_PtrStart(iVar3);
  for (Entry = 0; iVar3 = Vec_WecSize(p_00), Entry < iVar3; Entry = Entry + 1) {
    pVVar8 = Vec_WecEntry(p_00,Entry);
    for (iCo = 0; iVar3 = Vec_IntSize(pVVar8), iCo < iVar3; iCo = iCo + 1) {
      iVar3 = Vec_IntEntry(pVVar8,iCo);
      Entry_00 = Vec_PtrEntry(p_02,Entry);
      Vec_PtrWriteEntry(vSopsRepr,iVar3,Entry_00);
    }
  }
  iVar3 = Vec_PtrCountZero(vSopsRepr);
  if (iVar3 != 0) {
    __assert_fail("Vec_PtrCountZero(vSops) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCollapse.c"
                  ,0x34b,
                  "Vec_Ptr_t *Abc_GiaDeriveSops(Abc_Ntk_t *, Gia_Man_t *, Vec_Wec_t *, int, int, int, int, int, int, int)"
                 );
  }
LAB_0027f07f:
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  Vec_IntFree(p_01);
  Vec_WecFree(p_00);
  Vec_PtrFree(p_02);
  return vSopsRepr;
}

Assistant:

Vec_Ptr_t * Abc_GiaDeriveSops( Abc_Ntk_t * pNtkNew, Gia_Man_t * p, Vec_Wec_t * vSupps, int nCubeLim, int nBTLimit, int nCostMax, int fCanon, int fReverse, int fCnfShared, int fVerbose )
{
    ProgressBar * pProgress;
    abctime clk = Abc_Clock();
    Vec_Ptr_t * vSops = NULL, * vSopsRepr;
    Vec_Int_t * vReprs, * vClass, * vReprSuppSizes;
    int i, k, Entry, iCo, * pOrder;
    Vec_Wec_t * vClasses;
    Cnf_Dat_t * pCnf = NULL;
    Vec_Int_t * vMap = NULL;
    // derive classes of outputs
    vClasses = Gia_ManIsoStrashReduceInt( p, vSupps, 0 );
    if ( fVerbose )
    {
        printf( "Considering %d (out of %d) outputs. ", Vec_WecSize(vClasses), Gia_ManCoNum(p) );
        Abc_PrintTime( 1, "Reduction time", Abc_Clock() - clk );
    }
    // derive representatives
    vReprs = Vec_WecCollectFirsts( vClasses );
    vReprSuppSizes = Vec_IntAlloc( Vec_IntSize(vReprs) );
    Vec_IntForEachEntry( vReprs, Entry, i )
        Vec_IntPush( vReprSuppSizes, Vec_IntSize(Vec_WecEntry(vSupps, Entry)) );
    pOrder = Abc_MergeSortCost( Vec_IntArray(vReprSuppSizes), Vec_IntSize(vReprSuppSizes) );
    Vec_IntFree( vReprSuppSizes );
    // consider SOPs for representatives
    if ( fCnfShared )
    {
        vMap = Vec_IntStartFull( Gia_ManObjNum(p) );
        pCnf = Mf_ManGenerateCnf( p, 8, 1, 0, 0 );
    }
    vSopsRepr = Vec_PtrStart( Vec_IntSize(vReprs) );
    pProgress = Extra_ProgressBarStart( stdout, Vec_IntSize(vReprs) );
    Extra_ProgressBarUpdate( pProgress, 0, NULL );
    for ( i = 0; i < Vec_IntSize(vReprs); i++ )
    {
        int iEntry        = pOrder[Vec_IntSize(vReprs) - 1 - i];
        int iCoThis       = Vec_IntEntry( vReprs, iEntry );
        Vec_Int_t * vSupp = Vec_WecEntry( vSupps, iCoThis );
        Vec_Str_t * vSop;
        if ( Vec_IntSize(vSupp) < 2 )
        {
            Vec_PtrWriteEntry( vSopsRepr, iEntry, (void *)(ABC_PTRINT_T)1 );
            continue;
        }
        if ( fCnfShared && !fCanon )
            vSop = Abc_NtkClpGiaOne2( pCnf, p, iCoThis, nCubeLim, nBTLimit, fCanon, fReverse, vSupp, vMap, i ? 0 : fVerbose, Vec_WecEntry(vClasses, iEntry), vSupps );
        else
            vSop = Abc_NtkClpGiaOne( p, iCoThis, nCubeLim, nBTLimit, fCanon, fReverse, vSupp, i ? 0 : fVerbose, Vec_WecEntry(vClasses, iEntry), vSupps );
        if ( vSop == NULL )
            goto finish;
        assert( Vec_IntSize( Vec_WecEntry(vSupps, iCoThis) ) == Abc_SopGetVarNum(Vec_StrArray(vSop)) );
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        Vec_PtrWriteEntry( vSopsRepr, iEntry, Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Vec_StrArray(vSop) ) );
        Vec_StrFree( vSop );
    }
    Extra_ProgressBarStop( pProgress );
    if ( fCnfShared )
    {
        Cnf_DataFree( pCnf );
        Vec_IntFree( vMap );
    }
    // derive SOPs for each output
    vSops = Vec_PtrStart( Gia_ManCoNum(p) );
    Vec_WecForEachLevel ( vClasses, vClass, i )
        Vec_IntForEachEntry( vClass, iCo, k )
            Vec_PtrWriteEntry( vSops, iCo, Vec_PtrEntry(vSopsRepr, i) );
    assert( Vec_PtrCountZero(vSops) == 0 );
/*
    // verify
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
    {
        Vec_Int_t * vSupp = Vec_WecEntry( vSupps, i );
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        assert( Vec_IntSize(vSupp) == Abc_SopGetVarNum(pSop) );
    }
*/
    // cleanup
finish:
    ABC_FREE( pOrder );
    Vec_IntFree( vReprs );
    Vec_WecFree( vClasses );
    Vec_PtrFree( vSopsRepr );
    return vSops;
}